

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O3

size_t __thiscall
BamTools::ConvertTool::ConvertToolPrivate::PrintBArrayValues
          (ConvertToolPrivate *this,char *tagData,size_t tagDataLength)

{
  byte bVar1;
  uint uVar2;
  size_t __n;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  BadDataException *pBVar6;
  char *pcVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (tagDataLength < 5) {
    pBVar6 = (BadDataException *)__cxa_allocate_exception(0x28);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Incomplete array tag data","");
    BadDataException::BadDataException(pBVar6,&local_70);
    __cxa_throw(pBVar6,&BadDataException::typeinfo,BadDataException::~BadDataException);
  }
  __n = (this->m_settings->Format)._M_string_length;
  if ((__n == DAT_001b28f8) &&
     ((__n == 0 ||
      (iVar4 = bcmp((this->m_settings->Format)._M_dataplus._M_p,FORMAT_SAM_abi_cxx11_,__n),
      iVar4 == 0)))) {
    bVar1 = *tagData;
    if (bVar1 < 99) {
      if (bVar1 == 0x43) {
        pcVar7 = "C,";
      }
      else if (bVar1 == 0x49) {
        pcVar7 = "I,";
      }
      else {
        if (bVar1 != 0x53) goto LAB_001137f5;
        pcVar7 = "S,";
      }
    }
    else if (bVar1 < 0x69) {
      if (bVar1 == 99) {
        pcVar7 = "c,";
      }
      else {
        if (bVar1 != 0x66) {
LAB_001137f5:
          pBVar6 = (BadDataException *)__cxa_allocate_exception(0x28);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"Unknown B array type: ","");
          std::operator+(&local_70,&local_50,*tagData);
          BadDataException::BadDataException(pBVar6,&local_70);
          __cxa_throw(pBVar6,&BadDataException::typeinfo,BadDataException::~BadDataException);
        }
        pcVar7 = "f,";
      }
    }
    else if (bVar1 == 0x69) {
      pcVar7 = "i,";
    }
    else {
      if (bVar1 != 0x73) goto LAB_001137f5;
      pcVar7 = "s,";
    }
    std::__ostream_insert<char,std::char_traits<char>>(&this->m_out,pcVar7,2);
  }
  uVar2 = *(uint *)(tagData + 1);
  bVar1 = *tagData;
  uVar9 = 0;
  uVar12 = 0;
  sVar5 = 5;
  if (bVar1 < 99) {
    if (bVar1 == 0x43) {
      if (tagDataLength == 5 || uVar2 == 0) goto LAB_0011372e;
      uVar9 = 0;
      do {
        if ((int)uVar9 != 0) {
          local_70._M_dataplus._M_p._0_1_ = 0x2c;
          std::__ostream_insert<char,std::char_traits<char>>(&this->m_out,(char *)&local_70,1);
        }
        std::ostream::operator<<(&this->m_out,(uint)(byte)tagData[uVar9 + 5]);
        uVar12 = uVar9 + 1;
      } while (((uint)uVar12 < uVar2) &&
              (uVar10 = uVar9 + 6, uVar9 = uVar12, uVar10 < tagDataLength));
LAB_0011365c:
      sVar5 = uVar12 + 5;
      goto LAB_0011372e;
    }
    if (bVar1 != 0x49) {
      if ((bVar1 == 0x53) && (6 < tagDataLength && uVar2 != 0)) {
        uVar12 = 0;
        sVar8 = 5;
        do {
          if ((int)uVar12 != 0) {
            local_70._M_dataplus._M_p._0_1_ = 0x2c;
            std::__ostream_insert<char,std::char_traits<char>>(&this->m_out,(char *)&local_70,1);
          }
          std::ostream::_M_insert<unsigned_long>((ulong)&this->m_out);
          uVar11 = (int)uVar12 + 1;
          uVar12 = (ulong)uVar11;
          sVar5 = sVar8 + 2;
        } while ((uVar11 < uVar2) && (uVar9 = sVar8 + 4, sVar8 = sVar5, uVar9 <= tagDataLength));
      }
      goto LAB_0011372e;
    }
    if (tagDataLength < 9 || uVar2 == 0) goto LAB_0011372e;
    uVar12 = 0;
    uVar9 = 0xd;
    do {
      if ((int)uVar12 != 0) {
        local_70._M_dataplus._M_p._0_1_ = 0x2c;
        std::__ostream_insert<char,std::char_traits<char>>(&this->m_out,(char *)&local_70,1);
      }
      std::ostream::_M_insert<unsigned_long>((ulong)&this->m_out);
      uVar11 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar11;
      uVar10 = uVar9 + 4;
    } while ((uVar11 < uVar2) && (bVar3 = uVar9 <= tagDataLength, uVar9 = uVar10, bVar3));
  }
  else if (bVar1 < 0x69) {
    uVar12 = uVar9;
    if (bVar1 == 99) {
      if (tagDataLength == 5 || uVar2 == 0) goto LAB_0011372e;
      uVar9 = 0;
      do {
        if ((int)uVar9 != 0) {
          local_70._M_dataplus._M_p._0_1_ = 0x2c;
          std::__ostream_insert<char,std::char_traits<char>>(&this->m_out,(char *)&local_70,1);
        }
        std::ostream::operator<<(&this->m_out,(int)tagData[uVar9 + 5]);
        uVar12 = uVar9 + 1;
      } while (((uint)uVar12 < uVar2) &&
              (uVar10 = uVar9 + 6, uVar9 = uVar12, uVar10 < tagDataLength));
      goto LAB_0011365c;
    }
    if ((bVar1 != 0x66) || (tagDataLength < 9 || uVar2 == 0)) goto LAB_0011372e;
    uVar12 = 0;
    uVar9 = 0xd;
    do {
      if ((int)uVar12 != 0) {
        local_70._M_dataplus._M_p._0_1_ = 0x2c;
        std::__ostream_insert<char,std::char_traits<char>>(&this->m_out,(char *)&local_70,1);
      }
      std::ostream::_M_insert<double>((double)*(float *)(tagData + (uVar9 - 8)));
      uVar11 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar11;
      uVar10 = uVar9 + 4;
    } while ((uVar11 < uVar2) && (bVar3 = uVar9 <= tagDataLength, uVar9 = uVar10, bVar3));
  }
  else {
    if (bVar1 != 0x69) {
      if ((bVar1 == 0x73) && (6 < tagDataLength && uVar2 != 0)) {
        uVar12 = 0;
        sVar8 = 5;
        do {
          if ((int)uVar12 != 0) {
            local_70._M_dataplus._M_p._0_1_ = 0x2c;
            std::__ostream_insert<char,std::char_traits<char>>(&this->m_out,(char *)&local_70,1);
          }
          std::ostream::operator<<(&this->m_out,*(short *)(tagData + sVar8));
          uVar11 = (int)uVar12 + 1;
          uVar12 = (ulong)uVar11;
          sVar5 = sVar8 + 2;
        } while ((uVar11 < uVar2) && (uVar9 = sVar8 + 4, sVar8 = sVar5, uVar9 <= tagDataLength));
      }
      goto LAB_0011372e;
    }
    if (tagDataLength < 9 || uVar2 == 0) goto LAB_0011372e;
    uVar12 = 0;
    uVar9 = 0xd;
    do {
      if ((int)uVar12 != 0) {
        local_70._M_dataplus._M_p._0_1_ = 0x2c;
        std::__ostream_insert<char,std::char_traits<char>>(&this->m_out,(char *)&local_70,1);
      }
      std::ostream::operator<<(&this->m_out,*(int *)(tagData + (uVar9 - 8)));
      uVar11 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar11;
      uVar10 = uVar9 + 4;
    } while ((uVar11 < uVar2) && (bVar3 = uVar9 <= tagDataLength, uVar9 = uVar10, bVar3));
  }
  sVar5 = uVar10 - 8;
LAB_0011372e:
  if ((uint)uVar12 < uVar2) {
    pBVar6 = (BadDataException *)__cxa_allocate_exception(0x28);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Incomplete array tag data","");
    BadDataException::BadDataException(pBVar6,&local_70);
    __cxa_throw(pBVar6,&BadDataException::typeinfo,BadDataException::~BadDataException);
  }
  return sVar5;
}

Assistant:

std::size_t ConvertTool::ConvertToolPrivate::PrintBArrayValues(const char* tagData,
                                                               std::size_t tagDataLength)
{
    // Need at least 5 bytes for type and array length
    if (tagDataLength < 5) {
        throw BadDataException("Incomplete array tag data");
    }

    if (m_settings->Format == FORMAT_SAM) {
        // Print array type letter
        switch (tagData[0]) {
            case (Constants::BAM_TAG_TYPE_INT8):
                m_out << "c,";
                break;
            case (Constants::BAM_TAG_TYPE_UINT8):
                m_out << "C,";
                break;
            case (Constants::BAM_TAG_TYPE_INT16):
                m_out << "s,";
                break;
            case (Constants::BAM_TAG_TYPE_UINT16):
                m_out << "S,";
                break;
            case (Constants::BAM_TAG_TYPE_INT32):
                m_out << "i,";
                break;
            case (Constants::BAM_TAG_TYPE_UINT32):
                m_out << "I,";
                break;
            case (Constants::BAM_TAG_TYPE_FLOAT):
                m_out << "f,";
                break;
            default:
                throw BadDataException(std::string("Unknown B array type: ") + tagData[0]);
        }
    }

    uint32_t arrayLength = BamTools::UnpackUnsignedInt(&tagData[1]);
    std::size_t index = 1 + sizeof(uint32_t);
    uint32_t i = 0;

    // Print array values.
    switch (tagData[0]) {
        case (Constants::BAM_TAG_TYPE_INT8):
            for (i = 0; i < arrayLength && index + sizeof(int8_t) <= tagDataLength;
                 i++, index += sizeof(int8_t)) {
                if (i > 0) {
                    m_out << ',';
                }
                m_out << int(static_cast<int8_t>(tagData[index]));
            }
            break;

        case (Constants::BAM_TAG_TYPE_UINT8):
            for (i = 0; i < arrayLength && index + sizeof(uint8_t) <= tagDataLength;
                 i++, index += sizeof(uint8_t)) {
                if (i > 0) {
                    m_out << ',';
                }
                m_out << int(static_cast<uint8_t>(tagData[index]));
            }
            break;

        case (Constants::BAM_TAG_TYPE_INT16):
            for (i = 0; i < arrayLength && index + sizeof(int16_t) <= tagDataLength;
                 i++, index += sizeof(int16_t)) {
                if (i > 0) {
                    m_out << ',';
                }
                m_out << BamTools::UnpackSignedShort(&tagData[index]);
            }
            break;

        case (Constants::BAM_TAG_TYPE_UINT16):
            for (i = 0; i < arrayLength && index + sizeof(uint16_t) <= tagDataLength;
                 i++, index += sizeof(uint16_t)) {
                if (i > 0) {
                    m_out << ',';
                }
                m_out << BamTools::UnpackUnsignedShort(&tagData[index]);
            }
            break;

        case (Constants::BAM_TAG_TYPE_INT32):
            for (i = 0; i < arrayLength && index + sizeof(int32_t) <= tagDataLength;
                 i++, index += sizeof(int32_t)) {
                if (i > 0) {
                    m_out << ',';
                }
                m_out << BamTools::UnpackSignedInt(&tagData[index]);
            }
            break;

        case (Constants::BAM_TAG_TYPE_UINT32):
            for (i = 0; i < arrayLength && index + sizeof(uint32_t) <= tagDataLength;
                 i++, index += sizeof(uint32_t)) {
                if (i > 0) {
                    m_out << ',';
                }
                m_out << BamTools::UnpackUnsignedInt(&tagData[index]);
            }
            break;

        case (Constants::BAM_TAG_TYPE_FLOAT):
            for (i = 0; i < arrayLength && index + sizeof(float) <= tagDataLength;
                 i++, index += sizeof(float)) {
                if (i > 0) {
                    m_out << ',';
                }
                m_out << BamTools::UnpackFloat(&tagData[index]);
            }
            break;
    }
    if (i < arrayLength) {
        throw BadDataException("Incomplete array tag data");
    }

    return index;
}